

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

void ndiCloseNetwork(ndicapi *device)

{
  ndiSetThreadMode(device,false);
  ndiSocketClose(device->Socket);
  free(device->Hostname);
  free(device->Command);
  free(device->Reply);
  free(device->ReplyNoCRC);
  device->Hostname = (char *)0x0;
  device->Port = -1;
  device->Socket = -1;
  free(device);
  return;
}

Assistant:

ndicapiExport void ndiCloseNetwork(ndicapi* device)
{
  // end the tracking thread if it is running
  ndiSetThreadMode(device, 0);

  // close the serial port
  ndiSocketClose(device->Socket);

  // free the buffers
  free(device->Hostname);
  free(device->Command);
  free(device->Reply);
  free(device->ReplyNoCRC);
  device->Hostname = NULL;
  device->Port = -1;
  device->Socket = -1;

  free(device);
}